

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mp::ArrayRef<int>::move_or_copy
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ArrayRef<int> *this)

{
  pointer piVar1;
  pointer piVar2;
  allocator_type local_9;
  
  piVar1 = (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 == piVar1) {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,this->data_,
               this->data_ + this->size_,&local_9);
  }
  else {
    this->data_ = (int *)0x0;
    this->size_ = 0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = piVar1;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> move_or_copy() {
      if (save_.size()) {
        data_ = nullptr;
        size_ = 0;
        return std::move(save_);
      }
      return { begin(), end() };
    }